

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

CountExpr __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_testing::NiceMock<MockNLHandler>_>::
ReadCountExpr(NLReader<mp::internal::TextReader<fmt::Locale>,_testing::NiceMock<MockNLHandler>_>
              *this)

{
  int num_args_00;
  CountExpr CVar1;
  NLReader<mp::internal::TextReader<fmt::Locale>,_testing::NiceMock<MockNLHandler>_> *in_RDI;
  CountArgHandler args;
  int num_args;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffec;
  NLReader<mp::internal::TextReader<fmt::Locale>,_testing::NiceMock<MockNLHandler>_> *this_00;
  
  this_00 = in_RDI;
  num_args_00 = ReadNumArgs(in_RDI,in_stack_ffffffffffffffec);
  NLHandler<MockNLHandler,_BasicTestExpr<0>_>::BeginCount
            ((NLHandler<MockNLHandler,_BasicTestExpr<0>_> *)in_RDI,in_stack_ffffffffffffffdc);
  NLReader<mp::internal::TextReader<fmt::Locale>,testing::NiceMock<MockNLHandler>>::
  ReadArgs<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,testing::NiceMock<MockNLHandler>>::LogicalExprReader,mp::NLHandler<MockNLHandler,BasicTestExpr<0>>::ArgHandler>
            (this_00,num_args_00,(ArgHandler *)in_RDI);
  CVar1 = NLHandler<MockNLHandler,_BasicTestExpr<0>_>::EndCount
                    ((NLHandler<MockNLHandler,_BasicTestExpr<0>_> *)in_RDI->handler_);
  return (CountExpr)CVar1.id_;
}

Assistant:

typename Handler::CountExpr ReadCountExpr() {
    int num_args = ReadNumArgs(1);
    typename Handler::CountArgHandler args = handler_.BeginCount(num_args);
    ReadArgs<LogicalExprReader>(num_args, args);
    return handler_.EndCount(args);
  }